

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ransac.hpp
# Opt level: O3

bool __thiscall
opengv::sac::Ransac<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>::
computeModel(Ransac<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem> *this,
            int debug_verbosity_level)

{
  int *piVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  vector<int,_std::allocator<int>_> selection;
  ActualDstType actualDst;
  model_t model_coefficients;
  vector<int,_std::allocator<int>_> local_f0;
  vector<int,_std::allocator<int>_> *local_d0;
  model_t *local_c8;
  double local_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  double local_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  double local_80;
  double dStack_78;
  double dStack_70;
  double dStack_68;
  
  (this->super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
  iterations_ = 0;
  local_d0 = &(this->
              super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
              ).model_;
  local_c8 = &(this->
              super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
              ).model_coefficients_;
  piVar1 = &(this->
            super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
            ).iterations_;
  uVar10 = 0x80000001;
  uVar14 = 0;
  uVar15 = 0;
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dVar16 = 1.0;
  iVar2 = (this->
          super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>)
          .max_iterations_;
  do {
    if (dVar16 <= (double)(int)uVar14) {
LAB_00132d9e:
      if (debug_verbosity_level < 1) goto LAB_00132dd3;
      goto LAB_00132da5;
    }
    while( true ) {
      if ((uint)(iVar2 * 10) <= uVar15) goto LAB_00132d9e;
      peVar3 = (this->
               super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
               ).sac_model_.
               super___shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*(peVar3->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        _vptr_SampleConsensusProblem[2])(peVar3,piVar1,&local_f0);
      if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        computeModel();
        goto LAB_00132d9e;
      }
      peVar3 = (this->
               super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
               ).sac_model_.
               super___shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      iVar11 = (*(peVar3->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                 _vptr_SampleConsensusProblem[5])(peVar3,&local_f0,&local_c0);
      if ((char)iVar11 != '\0') break;
      if (dVar16 <= (double)*piVar1) goto LAB_00132d9e;
      uVar15 = uVar15 + 1;
    }
    peVar3 = (this->
             super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
             ).sac_model_.
             super___shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar12 = (*(peVar3->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
               _vptr_SampleConsensusProblem[10])
                       ((this->
                        super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                        ).threshold_,peVar3,&local_c0);
    if ((int)uVar10 < (int)uVar12) {
      std::vector<int,_std::allocator<int>_>::operator=(local_d0,&local_f0);
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      model_coefficients_.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
      m_data.array[0] = local_c0;
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      model_coefficients_.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
      m_data.array[1] = dStack_b8;
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      model_coefficients_.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
      m_data.array[2] = dStack_b0;
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      model_coefficients_.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
      m_data.array[3] = dStack_a8;
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      model_coefficients_.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
      m_data.array[4] = local_a0;
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      model_coefficients_.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
      m_data.array[5] = dStack_98;
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      model_coefficients_.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
      m_data.array[6] = dStack_90;
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      model_coefficients_.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
      m_data.array[7] = dStack_88;
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      model_coefficients_.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
      m_data.array[8] = local_80;
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      model_coefficients_.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
      m_data.array[9] = dStack_78;
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      model_coefficients_.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
      m_data.array[10] = dStack_70;
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      model_coefficients_.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
      m_data.array[0xb] = dStack_68;
      peVar3 = (this->
               super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
               ).sac_model_.
               super___shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      peVar4 = (peVar3->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
               indices_.
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      this_00 = (peVar3->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                indices_.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        lVar13 = (long)(peVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&(peVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        lVar13 = (long)(peVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&(peVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      auVar8._8_8_ = in_XMM2_Qb;
      auVar8._0_8_ = in_XMM2_Qa;
      auVar8 = vcvtusi2sd_avx512f(auVar8,lVar13 >> 2);
      auVar9._8_8_ = in_XMM2_Qb;
      auVar9._0_8_ = in_XMM2_Qa;
      auVar9 = vcvtusi2sd_avx512f(auVar9,(long)local_f0.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                         (long)local_f0.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start >> 2);
      dVar16 = pow((double)(int)uVar12 / auVar8._0_8_,auVar9._0_8_);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = 1.0 - dVar16;
      auVar8 = vmaxsd_avx(auVar18,ZEXT816(0x3cb0000000000000));
      auVar8 = vminsd_avx(auVar8,ZEXT816(0x3feffffffffffffe));
      dVar16 = log(1.0 - (this->
                         super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                         ).probability_);
      dVar17 = log(auVar8._0_8_);
      dVar16 = dVar16 / dVar17;
      uVar10 = uVar12;
    }
    uVar14 = (ulong)(*piVar1 + 1U);
    *piVar1 = *piVar1 + 1U;
    if (1 < debug_verbosity_level) {
      fprintf(_stdout,
              "[sm::RandomSampleConsensus::computeModel] Trial %d out of %f: %d inliers (best is: %d so far).\n"
              ,uVar14,(ulong)uVar12,(ulong)uVar10);
      uVar14 = (ulong)(uint)*piVar1;
    }
  } while ((int)uVar14 <=
           (this->
           super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
           ).max_iterations_);
  if (0 < debug_verbosity_level) {
    fwrite("[sm::RandomSampleConsensus::computeModel] RANSAC reached the maximum number of trials.\n"
           ,0x57,1,_stdout);
LAB_00132da5:
    fprintf(_stdout,"[sm::RandomSampleConsensus::computeModel] Model: %zu size, %d inliers.\n",
            (long)(this->
                  super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                  ).model_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->
                  super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                  ).model_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2,(ulong)uVar10);
  }
LAB_00132dd3:
  piVar5 = (this->
           super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
           ).model_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar6 = (this->
           super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
           ).model_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar5 == piVar6) {
    piVar7 = (this->
             super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
             ).inliers_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->
        super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
        inliers_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != piVar7) {
      (this->
      super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>).
      inliers_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar7;
    }
  }
  else {
    peVar3 = (this->
             super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
             ).sac_model_.
             super___shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*(peVar3->super_SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
      _vptr_SampleConsensusProblem[9])
              ((this->
               super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
               ).threshold_,peVar3,local_c8,
               &(this->
                super_SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                ).inliers_);
  }
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return piVar5 != piVar6;
}

Assistant:

bool
opengv::sac::Ransac<PROBLEM_T>::computeModel(
    int debug_verbosity_level)
{
  typedef PROBLEM_T problem_t;
  typedef typename problem_t::model_t model_t;

  iterations_ = 0;
  int n_best_inliers_count = -INT_MAX;
  double k = 1.0;

  std::vector<int> selection;
  model_t model_coefficients;

  int n_inliers_count = 0;
  unsigned skipped_count = 0;
  // supress infinite loops by just allowing 10 x maximum allowed iterations for
  // invalid model parameters!
  const unsigned max_skip = max_iterations_ * 10;

  // Iterate
  while( iterations_ < k && skipped_count < max_skip )
  {
    // Get X samples which satisfy the model criteria
    sac_model_->getSamples( iterations_, selection );

    if(selection.empty()) 
    {
      fprintf(stderr,
          "[sm::RandomSampleConsensus::computeModel] No samples could be selected!\n");
      break;
    }

    // Search for inliers in the point cloud for the current plane model M
    if(!sac_model_->computeModelCoefficients( selection, model_coefficients ))
    {
      //++iterations_;
      ++ skipped_count;
      continue;
    }

    // Select the inliers that are within threshold_ from the model
    //sac_model_->selectWithinDistance( model_coefficients, threshold_, inliers );
    //if(inliers.empty() && k > 1.0)
    //  continue;

    n_inliers_count = sac_model_->countWithinDistance(
        model_coefficients, threshold_ );

    // Better match ?
    if(n_inliers_count > n_best_inliers_count)
    {
      n_best_inliers_count = n_inliers_count;

      // Save the current model/inlier/coefficients selection as being the best so far
      model_              = selection;
      model_coefficients_ = model_coefficients;

      // Compute the k parameter (k=log(z)/log(1-w^n))
      double w = static_cast<double> (n_best_inliers_count) /
          static_cast<double> (sac_model_->getIndices()->size());
      double p_no_outliers = 1.0 - pow(w, static_cast<double> (selection.size()));
      p_no_outliers =
          (std::max) (std::numeric_limits<double>::epsilon(), p_no_outliers);
          // Avoid division by -Inf
      p_no_outliers =
          (std::min) (1.0 - std::numeric_limits<double>::epsilon(), p_no_outliers);
          // Avoid division by 0.
      k = log(1.0 - probability_) / log(p_no_outliers);
    }

    ++iterations_;
    if(debug_verbosity_level > 1)
      fprintf(stdout,
          "[sm::RandomSampleConsensus::computeModel] Trial %d out of %f: %d inliers (best is: %d so far).\n",
          iterations_, k, n_inliers_count, n_best_inliers_count );
    if(iterations_ > max_iterations_)
    {
      if(debug_verbosity_level > 0)
        fprintf(stdout,
            "[sm::RandomSampleConsensus::computeModel] RANSAC reached the maximum number of trials.\n");
      break;
    }
  }

  if(debug_verbosity_level > 0)
    fprintf(stdout,
        "[sm::RandomSampleConsensus::computeModel] Model: %zu size, %d inliers.\n",
        model_.size(), n_best_inliers_count );

  if(model_.empty())
  {
    inliers_.clear();
    return (false);
  }

  // Get the set of inliers that correspond to the best model found so far
  sac_model_->selectWithinDistance( model_coefficients_, threshold_, inliers_ );

  return (true);
}